

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::pivotColumnFtran(HEkk *this,HighsInt iCol,HVector *col_aq)

{
  HighsSimplexAnalysis *this_00;
  
  this_00 = &this->analysis_;
  HighsSimplexAnalysis::simplexTimerStart(this_00,0x42,0);
  HVectorBase<double>::clear(col_aq);
  col_aq->packFlag = true;
  HighsSparseMatrix::collectAj(&(this->lp_).a_matrix_,col_aq,iCol,1.0);
  if ((this->analysis_).analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore(this_00,6,col_aq,(this->info_).col_aq_density);
  }
  HSimplexNla::ftran(&this->simplex_nla_,col_aq,(this->info_).col_aq_density,
                     (this->analysis_).pointer_serial_factor_clocks);
  if ((this->analysis_).analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(this_00,6,col_aq);
  }
  updateOperationResultDensity
            (this,(double)col_aq->count / (double)(this->lp_).num_row_,&(this->info_).col_aq_density
            );
  HighsSimplexAnalysis::simplexTimerStop(this_00,0x42,0);
  return;
}

Assistant:

void HEkk::pivotColumnFtran(const HighsInt iCol, HVector& col_aq) {
  analysis_.simplexTimerStart(FtranClock);
  col_aq.clear();
  col_aq.packFlag = true;
  lp_.a_matrix_.collectAj(col_aq, iCol, 1);
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordBefore(kSimplexNlaFtran, col_aq,
                                    info_.col_aq_density);
  simplex_nla_.ftran(col_aq, info_.col_aq_density,
                     analysis_.pointer_serial_factor_clocks);
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordAfter(kSimplexNlaFtran, col_aq);
  HighsInt num_row = lp_.num_row_;
  const double local_col_aq_density = (double)col_aq.count / num_row;
  updateOperationResultDensity(local_col_aq_density, info_.col_aq_density);
  analysis_.simplexTimerStop(FtranClock);
}